

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

string * __thiscall
testing::internal::DefaultParamName<std::tuple<char_const*,char_const*>>
          (string *__return_storage_ptr__,internal *this,
          TestParamInfo<std::tuple<const_char_*,_const_char_*>_> *info)

{
  TestParamInfo<std::tuple<const_char_*,_const_char_*>_> *info_local;
  
  std::__cxx11::to_string(__return_storage_ptr__,*(unsigned_long *)(this + 0x10));
  return __return_storage_ptr__;
}

Assistant:

std::string DefaultParamName(const TestParamInfo<ParamType>& info) {
  return std::to_string(info.index);
}